

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::rehashPowerOfTwo(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,size_t numBuckets)

{
  function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)> *pfVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Node *__ptr;
  uint8_t *puVar3;
  _Manager_type p_Var4;
  pointer pcVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Node *keyval;
  
  uVar7 = this->mMask + 1;
  if (uVar7 < 0x28f5c28f5c28f5d) {
    uVar8 = (uVar7 * 0x50) / 100;
  }
  else {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar7 >> 2;
    uVar8 = (SUB168(auVar6 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  __ptr = this->mKeyVals;
  puVar3 = this->mInfo;
  uVar9 = 0xff;
  if (uVar8 < 0xff) {
    uVar9 = uVar8;
  }
  init_data(this,numBuckets);
  if (1 < uVar9 + uVar7) {
    uVar8 = 0;
    keyval = __ptr;
    do {
      if (puVar3[uVar8] != '\0') {
        insert_move(this,keyval);
        p_Var4 = (keyval->mData).second.super__Function_base._M_manager;
        if (p_Var4 != (_Manager_type)0x0) {
          pfVar1 = &(keyval->mData).second;
          (*p_Var4)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
        }
        pcVar5 = (keyval->mData).first._M_dataplus._M_p;
        paVar2 = &(keyval->mData).first.field_2;
        if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar5) {
          operator_delete(pcVar5,paVar2->_M_allocated_capacity + 1);
        }
      }
      uVar8 = uVar8 + 1;
      keyval = keyval + 1;
    } while (uVar9 + uVar7 != uVar8);
    if (__ptr != (Node *)&this->mMask) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void rehashPowerOfTwo(size_t numBuckets) {
        ROBIN_HOOD_TRACE(this)

        Node* const oldKeyVals = mKeyVals;
        uint8_t const* const oldInfo = mInfo;

        const size_t oldMaxElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        // resize operation: move stuff
        init_data(numBuckets);
        if (oldMaxElementsWithBuffer > 1) {
            for (size_t i = 0; i < oldMaxElementsWithBuffer; ++i) {
                if (oldInfo[i] != 0) {
                    insert_move(std::move(oldKeyVals[i]));
                    // destroy the node but DON'T destroy the data.
                    oldKeyVals[i].~Node();
                }
            }

            // this check is not necessary as it's guarded by the previous if, but it helps silence
            // g++'s overeager "attempt to free a non-heap object 'map'
            // [-Werror=free-nonheap-object]" warning.
            if (oldKeyVals != reinterpret_cast_no_cast_align_warning<Node*>(&mMask)) {
                // don't destroy old data: put it into the pool instead
                DataPool::addOrFree(oldKeyVals, calcNumBytesTotal(oldMaxElementsWithBuffer));
            }
        }
    }